

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtmd.cpp
# Opt level: O0

int32_t mtmd_encode(mtmd_context *ctx,mtmd_image_tokens *image_tokens)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  float *pfVar5;
  mtmd_image_tokens *in_RSI;
  undefined8 *in_RDI;
  int n_tokens_per_image;
  size_t i;
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  *entries;
  clip_image_size slice_size;
  bool ok;
  int n_mmproj_embd;
  float *in_stack_00002290;
  clip_image_f32_batch *in_stack_00002298;
  int in_stack_000022a4;
  clip_ctx *in_stack_000022a8;
  unique_ptr<clip_image_f32,_clip_image_f32_deleter> *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff98;
  clip_ctx *ctx_00;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffa0;
  float *pfVar6;
  float *vec;
  clip_ctx *in_stack_ffffffffffffffd8;
  clip_image_f32 *img;
  int local_20;
  int n_threads;
  uint in_stack_ffffffffffffffe8;
  
  iVar2 = clip_n_mmproj_embd(in_stack_ffffffffffffffd8);
  mtmd_image_tokens::n_tokens(in_RSI);
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  in_stack_ffffffffffffffe8 = in_stack_ffffffffffffffe8 & 0xffffff;
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::operator[](&(in_RSI->batch_f32).entries,0);
  pcVar4 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                     ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x19a5c5);
  local_20 = pcVar4->nx;
  std::
  vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
  ::operator[](&(in_RSI->batch_f32).entries,0);
  pcVar4 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::operator->
                     ((unique_ptr<clip_image_f32,_clip_image_f32_deleter> *)0x19a5e5);
  n_threads = pcVar4->ny;
  clip_add_load_image_size((clip_ctx *)*in_RDI,(clip_image_size *)&local_20);
  bVar1 = clip_is_llava((clip_ctx *)*in_RDI);
  if (((bVar1) || (iVar3 = clip_is_minicpmv((clip_ctx *)*in_RDI), iVar3 != 0)) ||
     (bVar1 = clip_is_glm((clip_ctx *)*in_RDI), bVar1)) {
    img = (clip_image_f32 *)&in_RSI->batch_f32;
    pfVar6 = (float *)0x0;
    while (vec = pfVar6,
          pfVar5 = (float *)std::
                            vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                            ::size((vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                                    *)img), pfVar6 < pfVar5) {
      ctx_00 = (clip_ctx *)*in_RDI;
      std::
      vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
      ::operator[]((vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                    *)img,(size_type)vec);
      pcVar4 = std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::get
                         (in_stack_ffffffffffffff80);
      clip_n_patches_by_img(ctx_00,pcVar4);
      std::
      vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
      ::operator[]((vector<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>,_std::allocator<std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>_>_>
                    *)img,(size_type)vec);
      std::unique_ptr<clip_image_f32,_clip_image_f32_deleter>::get(in_stack_ffffffffffffff80);
      std::vector<float,_std::allocator<float>_>::data
                ((vector<float,_std::allocator<float>_> *)0x19a703);
      bVar1 = clip_image_encode((clip_ctx *)CONCAT44(iVar2,in_stack_ffffffffffffffe8),n_threads,img,
                                vec);
      in_stack_ffffffffffffffe8 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffe8);
      pfVar6 = (float *)((long)vec + 1);
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::data
              ((vector<float,_std::allocator<float>_> *)0x19a790);
    bVar1 = clip_image_batch_encode
                      (in_stack_000022a8,in_stack_000022a4,in_stack_00002298,in_stack_00002290);
    in_stack_ffffffffffffffe8 = (uint)bVar1 << 0x18;
  }
  return (uint)((in_stack_ffffffffffffffe8 & 0x1000000) == 0);
}

Assistant:

int32_t mtmd_encode(mtmd_context * ctx, const mtmd_image_tokens * image_tokens) {
    int n_mmproj_embd = clip_n_mmproj_embd(ctx->ctx_clip);
    ctx->image_embd_v.resize(image_tokens->n_tokens() * n_mmproj_embd);
    bool ok = false;

    // only effective for minicpmv and qwen2vl, other models will ignore load_image_size
    {
        clip_image_size slice_size{
            image_tokens->batch_f32.entries[0]->nx,
            image_tokens->batch_f32.entries[0]->ny};
        clip_add_load_image_size(ctx->ctx_clip, &slice_size);
    }

    if (clip_is_llava(ctx->ctx_clip) || clip_is_minicpmv(ctx->ctx_clip) || clip_is_glm(ctx->ctx_clip)) {
        // TODO @ngxson : llava does not support batched encoding ; this should be fixed inside clip_image_batch_encode()
        const auto & entries = image_tokens->batch_f32.entries;
        for (size_t i = 0; i < entries.size(); i++) {
            int n_tokens_per_image = clip_n_patches_by_img(ctx->ctx_clip, entries[i].get());
            ok = clip_image_encode(
                ctx->ctx_clip,
                ctx->n_threads,
                entries[i].get(),
                ctx->image_embd_v.data() + i*n_mmproj_embd*n_tokens_per_image);
        }
    } else {
        ok = clip_image_batch_encode(
            ctx->ctx_clip,
            ctx->n_threads,
            &image_tokens->batch_f32,
            ctx->image_embd_v.data());
    }

    return ok ? 0 : 1;
}